

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O0

int ssymm_(char *side,char *uplo,integer *m,integer *n,real *alpha,real *a,integer *lda,real *b,
          integer *ldb,real *beta,real *c__,integer *ldc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  logical lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int local_7c;
  int local_74;
  int local_6c;
  integer i__3;
  integer i__2;
  integer i__1;
  integer c_offset;
  integer c_dim1;
  integer b_offset;
  integer b_dim1;
  integer a_offset;
  integer a_dim1;
  real *a_local;
  real *alpha_local;
  integer *n_local;
  integer *m_local;
  char *uplo_local;
  char *side_local;
  
  iVar1 = *lda;
  iVar5 = iVar1 + 1;
  iVar2 = *ldb;
  iVar6 = iVar2 + 1;
  iVar3 = *ldc;
  iVar7 = iVar3 + 1;
  lVar8 = lsame_(side,"L");
  if (lVar8 == 0) {
    ssymm_::nrowa = *n;
  }
  else {
    ssymm_::nrowa = *m;
  }
  ssymm_::upper = lsame_(uplo,"U");
  ssymm_::info = 0;
  lVar8 = lsame_(side,"L");
  if ((lVar8 == 0) && (lVar8 = lsame_(side,"R"), lVar8 == 0)) {
    ssymm_::info = 1;
  }
  else if ((ssymm_::upper == 0) && (lVar8 = lsame_(uplo,"L"), lVar8 == 0)) {
    ssymm_::info = 2;
  }
  else if (*m < 0) {
    ssymm_::info = 3;
  }
  else if (*n < 0) {
    ssymm_::info = 4;
  }
  else {
    if (ssymm_::nrowa < 2) {
      local_6c = 1;
    }
    else {
      local_6c = ssymm_::nrowa;
    }
    if (*lda < local_6c) {
      ssymm_::info = 7;
    }
    else {
      if (*m < 2) {
        local_74 = 1;
      }
      else {
        local_74 = *m;
      }
      if (*ldb < local_74) {
        ssymm_::info = 9;
      }
      else {
        if (*m < 2) {
          local_7c = 1;
        }
        else {
          local_7c = *m;
        }
        if (*ldc < local_7c) {
          ssymm_::info = 0xc;
        }
      }
    }
  }
  if (ssymm_::info == 0) {
    if (((*m != 0) && (*n != 0)) &&
       ((*alpha != 0.0 || (((NAN(*alpha) || (*beta != 1.0)) || (NAN(*beta))))))) {
      if ((*alpha != 0.0) || (NAN(*alpha))) {
        lVar8 = lsame_(side,"L");
        if (lVar8 == 0) {
          iVar4 = *n;
          for (ssymm_::j = 1; ssymm_::j <= iVar4; ssymm_::j = ssymm_::j + 1) {
            ssymm_::temp1 = *alpha * a[(long)(ssymm_::j + ssymm_::j * iVar1) - (long)iVar5];
            if ((*beta != 0.0) || (NAN(*beta))) {
              iVar10 = *m;
              for (ssymm_::i__ = 1; ssymm_::i__ <= iVar10; ssymm_::i__ = ssymm_::i__ + 1) {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     *beta * c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] +
                     ssymm_::temp1 * b[(long)(ssymm_::i__ + ssymm_::j * iVar2) - (long)iVar6];
              }
            }
            else {
              iVar10 = *m;
              for (ssymm_::i__ = 1; ssymm_::i__ <= iVar10; ssymm_::i__ = ssymm_::i__ + 1) {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     ssymm_::temp1 * b[(long)(ssymm_::i__ + ssymm_::j * iVar2) - (long)iVar6];
              }
            }
            iVar10 = ssymm_::j + -1;
            for (ssymm_::k = 1; ssymm_::k <= iVar10; ssymm_::k = ssymm_::k + 1) {
              if (ssymm_::upper == 0) {
                ssymm_::temp1 = *alpha * a[(long)(ssymm_::j + ssymm_::k * iVar1) - (long)iVar5];
              }
              else {
                ssymm_::temp1 = *alpha * a[(long)(ssymm_::k + ssymm_::j * iVar1) - (long)iVar5];
              }
              iVar9 = *m;
              for (ssymm_::i__ = 1; ssymm_::i__ <= iVar9; ssymm_::i__ = ssymm_::i__ + 1) {
                lVar11 = (long)(ssymm_::i__ + ssymm_::j * iVar3);
                c__[lVar11 - iVar7] =
                     ssymm_::temp1 * b[(long)(ssymm_::i__ + ssymm_::k * iVar2) - (long)iVar6] +
                     c__[lVar11 - iVar7];
              }
            }
            iVar10 = *n;
            ssymm_::k = ssymm_::j;
            while (ssymm_::k = ssymm_::k + 1, ssymm_::k <= iVar10) {
              if (ssymm_::upper == 0) {
                ssymm_::temp1 = *alpha * a[(long)(ssymm_::k + ssymm_::j * iVar1) - (long)iVar5];
              }
              else {
                ssymm_::temp1 = *alpha * a[(long)(ssymm_::j + ssymm_::k * iVar1) - (long)iVar5];
              }
              iVar9 = *m;
              for (ssymm_::i__ = 1; ssymm_::i__ <= iVar9; ssymm_::i__ = ssymm_::i__ + 1) {
                lVar11 = (long)(ssymm_::i__ + ssymm_::j * iVar3);
                c__[lVar11 - iVar7] =
                     ssymm_::temp1 * b[(long)(ssymm_::i__ + ssymm_::k * iVar2) - (long)iVar6] +
                     c__[lVar11 - iVar7];
              }
            }
          }
        }
        else if (ssymm_::upper == 0) {
          iVar4 = *n;
          for (ssymm_::j = 1; ssymm_::j <= iVar4; ssymm_::j = ssymm_::j + 1) {
            for (ssymm_::i__ = *m; 0 < ssymm_::i__; ssymm_::i__ = ssymm_::i__ + -1) {
              ssymm_::temp1 = *alpha * b[(long)(ssymm_::i__ + ssymm_::j * iVar2) - (long)iVar6];
              ssymm_::temp2 = 0.0;
              iVar10 = *m;
              ssymm_::k = ssymm_::i__;
              while (ssymm_::k = ssymm_::k + 1, ssymm_::k <= iVar10) {
                lVar11 = (long)(ssymm_::k + ssymm_::j * iVar3);
                c__[lVar11 - iVar7] =
                     ssymm_::temp1 * a[(long)(ssymm_::k + ssymm_::i__ * iVar1) - (long)iVar5] +
                     c__[lVar11 - iVar7];
                ssymm_::temp2 =
                     b[(long)(ssymm_::k + ssymm_::j * iVar2) - (long)iVar6] *
                     a[(long)(ssymm_::k + ssymm_::i__ * iVar1) - (long)iVar5] + ssymm_::temp2;
              }
              if ((*beta != 0.0) || (NAN(*beta))) {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     *alpha * ssymm_::temp2 +
                     *beta * c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] +
                     ssymm_::temp1 * a[(long)(ssymm_::i__ + ssymm_::i__ * iVar1) - (long)iVar5];
              }
              else {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     ssymm_::temp1 * a[(long)(ssymm_::i__ + ssymm_::i__ * iVar1) - (long)iVar5] +
                     *alpha * ssymm_::temp2;
              }
            }
          }
        }
        else {
          iVar4 = *n;
          for (ssymm_::j = 1; ssymm_::j <= iVar4; ssymm_::j = ssymm_::j + 1) {
            iVar10 = *m;
            for (ssymm_::i__ = 1; ssymm_::i__ <= iVar10; ssymm_::i__ = ssymm_::i__ + 1) {
              ssymm_::temp1 = *alpha * b[(long)(ssymm_::i__ + ssymm_::j * iVar2) - (long)iVar6];
              ssymm_::temp2 = 0.0;
              iVar9 = ssymm_::i__ + -1;
              for (ssymm_::k = 1; ssymm_::k <= iVar9; ssymm_::k = ssymm_::k + 1) {
                lVar11 = (long)(ssymm_::k + ssymm_::j * iVar3);
                c__[lVar11 - iVar7] =
                     ssymm_::temp1 * a[(long)(ssymm_::k + ssymm_::i__ * iVar1) - (long)iVar5] +
                     c__[lVar11 - iVar7];
                ssymm_::temp2 =
                     b[(long)(ssymm_::k + ssymm_::j * iVar2) - (long)iVar6] *
                     a[(long)(ssymm_::k + ssymm_::i__ * iVar1) - (long)iVar5] + ssymm_::temp2;
              }
              if ((*beta != 0.0) || (NAN(*beta))) {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     *alpha * ssymm_::temp2 +
                     *beta * c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] +
                     ssymm_::temp1 * a[(long)(ssymm_::i__ + ssymm_::i__ * iVar1) - (long)iVar5];
              }
              else {
                c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                     ssymm_::temp1 * a[(long)(ssymm_::i__ + ssymm_::i__ * iVar1) - (long)iVar5] +
                     *alpha * ssymm_::temp2;
              }
            }
          }
        }
      }
      else if ((*beta != 0.0) || (NAN(*beta))) {
        iVar1 = *n;
        for (ssymm_::j = 1; ssymm_::j <= iVar1; ssymm_::j = ssymm_::j + 1) {
          iVar2 = *m;
          for (ssymm_::i__ = 1; ssymm_::i__ <= iVar2; ssymm_::i__ = ssymm_::i__ + 1) {
            c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] =
                 *beta * c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7];
          }
        }
      }
      else {
        iVar1 = *n;
        for (ssymm_::j = 1; ssymm_::j <= iVar1; ssymm_::j = ssymm_::j + 1) {
          iVar2 = *m;
          for (ssymm_::i__ = 1; ssymm_::i__ <= iVar2; ssymm_::i__ = ssymm_::i__ + 1) {
            c__[(long)(ssymm_::i__ + ssymm_::j * iVar3) - (long)iVar7] = 0.0;
          }
        }
      }
    }
  }
  else {
    xerbla_("SSYMM ",&ssymm_::info);
  }
  return 0;
}

Assistant:

int ssymm_(char *side, char *uplo, integer *m, integer *n,
	real *alpha, real *a, integer *lda, real *b, integer *ldb, real *beta,
	 real *c__, integer *ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, c_dim1, c_offset, i__1, i__2,
	    i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp1, temp2;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYMM  performs one of the matrix-matrix operations

       C := alpha*A*B + beta*C,

    or

       C := alpha*B*A + beta*C,

    where alpha and beta are scalars,  A is a symmetric matrix and  B and
    C are  m by n matrices.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry,  SIDE  specifies whether  the  symmetric matrix  A
             appears on the  left or right  in the  operation as follows:

                SIDE = 'L' or 'l'   C := alpha*A*B + beta*C,

                SIDE = 'R' or 'r'   C := alpha*B*A + beta*C,

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of  the  symmetric  matrix   A  is  to  be
             referenced as follows:

                UPLO = 'U' or 'u'   Only the upper triangular part of the
                                    symmetric matrix is to be referenced.

                UPLO = 'L' or 'l'   Only the lower triangular part of the
                                    symmetric matrix is to be referenced.

             Unchanged on exit.

    M      - INTEGER.
             On entry,  M  specifies the number of rows of the matrix  C.
             M  must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix C.
             N  must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             m  when  SIDE = 'L' or 'l'  and is  n otherwise.
             Before entry  with  SIDE = 'L' or 'l',  the  m by m  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading m by m upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  m by m  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Before entry  with  SIDE = 'R' or 'r',  the  n by n  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading n by n upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  n by n  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA must be at least  max( 1, m ), otherwise  LDA must be at
             least  max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry, the leading  m by n part of the array  B  must
             contain the matrix B.
             Unchanged on exit.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry,  BETA  specifies the scalar  beta.  When  BETA  is
             supplied as zero then C need not be set on input.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry, the leading  m by n  part of the array  C must
             contain the matrix  C,  except when  beta  is zero, in which
             case C need not be set on entry.
             On exit, the array  C  is overwritten by the  m by n updated
             matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Set NROWA as the number of rows of A.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(side, "L")) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    upper = lsame_(uplo, "U");

/*     Test the input parameters. */

    info = 0;
    if (! lsame_(side, "L") && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (*m < 0) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldb < max(1,*m)) {
	info = 9;
    } else if (*ldc < max(1,*m)) {
	info = 12;
    }
    if (info != 0) {
	xerbla_("SSYMM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (*beta == 0.f) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		}
/* L20: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		}
/* L40: */
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(side, "L")) {

/*        Form  C := alpha*A*B + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__3 = i__ - 1;
		    for (k = 1; k <= i__3; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L50: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L60: */
		}
/* L70: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		for (i__ = *m; i__ >= 1; --i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__2 = *m;
		    for (k = i__ + 1; k <= i__2; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L80: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L90: */
		}
/* L100: */
	    }
	}
    } else {

/*        Form  C := alpha*B*A + beta*C. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    temp1 = *alpha * a[j + j * a_dim1];
	    if (*beta == 0.f) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = temp1 * b[i__ + j * b_dim1];
/* L110: */
		}
	    } else {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1] +
			    temp1 * b[i__ + j * b_dim1];
/* L120: */
		}
	    }
	    i__2 = j - 1;
	    for (k = 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[k + j * a_dim1];
		} else {
		    temp1 = *alpha * a[j + k * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L130: */
		}
/* L140: */
	    }
	    i__2 = *n;
	    for (k = j + 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[j + k * a_dim1];
		} else {
		    temp1 = *alpha * a[k + j * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L150: */
		}
/* L160: */
	    }
/* L170: */
	}
    }

    return 0;

/*     End of SSYMM . */

}